

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::Group::Group(Group *this,Group *group_,string *help_,
                  function<bool_(const_args::Group_&)> *validator_)

{
  Base::Base(&this->super_Base,help_);
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Group_001396f8;
  (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::function<bool_(const_args::Group_&)>::function(&this->validator,validator_);
  Add(group_,&this->super_Base);
  return;
}

Assistant:

Group(Group &group_, const std::string &help_ = std::string(), const std::function<bool(const Group &)> &validator_ = Validators::DontCare) : Base(help_), validator(validator_)
            {
                group_.Add(*this);
            }